

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse2_128_32.c
# Opt level: O3

parasail_result_t *
parasail_nw_table_diag_sse2_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  uint uVar9;
  parasail_result_t *ppVar10;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  __m128i_32_t A_3;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uVar28;
  int iVar29;
  undefined1 auVar30 [16];
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar48;
  int iVar49;
  __m128i_32_t A;
  int iVar50;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar55;
  int iVar56;
  int32_t iVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int32_t *local_130;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  undefined8 local_d8;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_table_diag_sse2_128_32_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_table_diag_sse2_128_32_cold_6();
  }
  else if (open < 0) {
    parasail_nw_table_diag_sse2_128_32_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_table_diag_sse2_128_32_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_table_diag_sse2_128_32_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_nw_table_diag_sse2_128_32_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar22 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_nw_table_diag_sse2_128_32_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar22 = (ulong)(uint)matrix->length;
    }
    iVar13 = -open;
    iVar7 = matrix->min;
    uVar31 = 0x80000000 - iVar7;
    if (iVar7 != iVar13 && SBORROW4(iVar7,iVar13) == iVar7 + open < 0) {
      uVar31 = open | 0x80000000;
    }
    iVar7 = 0x7ffffffe - matrix->max;
    uVar32 = (uint)uVar22;
    ppVar10 = parasail_result_new_table1(uVar32,s2Len);
    if (ppVar10 != (parasail_result_t *)0x0) {
      ppVar10->flag = ppVar10->flag | 0x4421001;
      uVar12 = (ulong)(s2Len + 6);
      ptr = parasail_memalign_int32_t(0x10,uVar12);
      ptr_00 = parasail_memalign_int32_t(0x10,uVar12);
      ptr_01 = parasail_memalign_int32_t(0x10,uVar12);
      if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
        if (matrix->type == 0) {
          iVar14 = uVar32 + 3;
          local_130 = parasail_memalign_int32_t(0x10,(long)iVar14);
          if (local_130 == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar32) {
            piVar3 = matrix->mapper;
            uVar12 = 0;
            do {
              local_130[uVar12] = piVar3[(byte)_s1[uVar12]];
              uVar12 = uVar12 + 1;
            } while (uVar22 != uVar12);
          }
          iVar29 = uVar32 + 1;
          if ((int)(uVar32 + 1) < iVar14) {
            iVar29 = iVar14;
          }
          memset(local_130 + (int)uVar32,0,(ulong)(~uVar32 + iVar29) * 4 + 4);
        }
        else {
          local_130 = (int32_t *)0x0;
        }
        uVar33 = s2Len + 3;
        uVar28 = uVar32 - 1;
        iVar29 = s2Len + -1;
        iVar14 = uVar31 + 1;
        local_d8 = CONCAT44(iVar29,uVar28);
        iStack_110 = iVar13 - gap;
        iStack_114 = iVar13 + gap * -2;
        local_118 = -(gap * 3 + open);
        piVar3 = matrix->mapper;
        uVar23 = (ulong)(uint)s2Len;
        uVar12 = 0;
        do {
          ptr[uVar12 + 3] = piVar3[(byte)_s2[uVar12]];
          uVar12 = uVar12 + 1;
        } while (uVar23 != uVar12);
        ptr[2] = 0;
        ptr[0] = 0;
        ptr[1] = 0;
        uVar31 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar33) {
          uVar31 = uVar33;
        }
        uVar12 = 0;
        memset(ptr + uVar23 + 3,0,(ulong)(~s2Len + uVar31) * 4 + 4);
        iVar8 = iVar13;
        do {
          ptr_00[uVar12 + 3] = iVar8;
          ptr_01[uVar12 + 3] = iVar14;
          uVar12 = uVar12 + 1;
          iVar8 = iVar8 - gap;
        } while (uVar23 != uVar12);
        lVar11 = 0;
        do {
          ptr_00[lVar11] = iVar14;
          ptr_01[lVar11] = iVar14;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        lVar11 = uVar23 + 3;
        do {
          ptr_00[lVar11] = iVar14;
          ptr_01[lVar11] = iVar14;
          lVar11 = lVar11 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar33);
        ptr_00[2] = 0;
        auVar24._4_4_ = iVar14;
        auVar24._0_4_ = iVar14;
        auVar24._8_4_ = iVar14;
        auVar24._12_4_ = iVar14;
        auVar38._4_4_ = iVar7;
        auVar38._0_4_ = iVar7;
        auVar38._8_4_ = iVar7;
        auVar38._12_4_ = iVar7;
        auVar26 = auVar24;
        if (0 < (int)uVar32) {
          piVar3 = matrix->matrix;
          auVar5._4_4_ = iVar14;
          auVar5._0_4_ = iVar14;
          auVar5._8_4_ = iVar14;
          auVar5._12_4_ = iVar14;
          uVar12 = 1;
          if (1 < (int)uVar33) {
            uVar12 = (ulong)uVar33;
          }
          local_e0 = uVar23 * 0xc + -0xc;
          lVar11 = uVar23 * 0x10;
          local_e8 = uVar23 * 4 + -4;
          local_f8 = uVar23 * 8 + -8;
          uVar31 = 3;
          uVar32 = 2;
          uVar33 = 1;
          uVar34 = 0;
          local_f0 = 0;
          uVar16 = 0;
          auVar24 = auVar5;
          auVar26 = auVar5;
          iStack_10c = iVar13;
          do {
            uVar17 = uVar16 | 3;
            uVar15 = (uint)uVar16;
            if (matrix->type == 0) {
              uVar9 = local_130[uVar16 + 1];
              uVar18 = local_130[uVar16 + 2];
              uVar20 = local_130[uVar16];
              uVar21 = local_130[uVar17];
            }
            else {
              uVar9 = uVar15 | 1;
              if (uVar22 <= (uVar16 | 1)) {
                uVar9 = uVar28;
              }
              uVar18 = uVar15 | 2;
              if (uVar22 <= (uVar16 | 2)) {
                uVar18 = uVar28;
              }
              uVar20 = uVar15;
              uVar21 = uVar15 | 3;
              if (uVar22 <= uVar17) {
                uVar21 = uVar28;
              }
            }
            iVar8 = matrix->size;
            uVar1 = uVar16 + 4;
            iVar57 = ptr_00[2];
            ptr_00[2] = iVar13 - (int)uVar1 * gap;
            auVar47._0_12_ = auVar5._4_12_;
            auVar47._12_4_ = iVar13 - uVar15 * gap;
            auVar40._0_4_ = -(uint)(uVar31 == uVar28);
            auVar40._4_4_ = -(uint)(uVar32 == uVar28);
            auVar40._8_4_ = -(uint)(uVar33 == uVar28);
            auVar40._12_4_ = -(uint)(uVar34 == uVar28);
            uVar19 = 0;
            iVar41 = -3;
            iVar42 = -2;
            iVar43 = -1;
            iVar44 = 0;
            auVar46._4_4_ = iVar14;
            auVar46._0_4_ = iVar14;
            auVar46._8_4_ = iVar14;
            auVar46._12_4_ = iVar14;
            iVar54 = iVar14;
            iVar55 = iVar14;
            iVar56 = iVar14;
            auVar63 = auVar46;
            do {
              iVar2 = ptr_00[uVar19 + 3];
              iVar48 = auVar47._4_4_;
              iVar49 = auVar47._8_4_;
              iVar50 = auVar47._12_4_;
              auVar35._0_4_ = piVar3[(long)(int)(uVar21 * iVar8) + (long)ptr[uVar19]] + iVar54;
              auVar35._4_4_ = piVar3[(long)(int)(uVar18 * iVar8) + (long)ptr[uVar19 + 1]] + iVar55;
              auVar35._8_4_ = piVar3[(long)(int)(uVar9 * iVar8) + (long)ptr[uVar19 + 2]] + iVar56;
              auVar35._12_4_ = piVar3[(long)(int)(uVar20 * iVar8) + (long)ptr[uVar19 + 3]] + iVar57;
              auVar59._0_4_ = iVar48 - open;
              auVar59._4_4_ = iVar49 - open;
              auVar59._8_4_ = iVar50 - open;
              auVar59._12_4_ = iVar2 - open;
              auVar62._0_4_ = auVar63._4_4_ - gap;
              auVar62._4_4_ = auVar63._8_4_ - gap;
              auVar62._8_4_ = auVar63._12_4_ - gap;
              auVar62._12_4_ = ptr_01[uVar19 + 3] - gap;
              auVar58._0_4_ = -(uint)(auVar62._0_4_ < auVar59._0_4_);
              auVar58._4_4_ = -(uint)(auVar62._4_4_ < auVar59._4_4_);
              auVar58._8_4_ = -(uint)(auVar62._8_4_ < auVar59._8_4_);
              auVar58._12_4_ = -(uint)(auVar62._12_4_ < auVar59._12_4_);
              auVar58 = ~auVar58 & auVar62 | auVar59 & auVar58;
              auVar61._0_4_ = auVar47._0_4_ - open;
              auVar61._4_4_ = iVar48 - open;
              auVar61._8_4_ = iVar49 - open;
              auVar61._12_4_ = iVar50 - open;
              auVar52._0_4_ = auVar46._0_4_ - gap;
              auVar52._4_4_ = auVar46._4_4_ - gap;
              auVar52._8_4_ = auVar46._8_4_ - gap;
              auVar52._12_4_ = auVar46._12_4_ - gap;
              auVar60._0_4_ = -(uint)(auVar52._0_4_ < auVar61._0_4_);
              auVar60._4_4_ = -(uint)(auVar52._4_4_ < auVar61._4_4_);
              auVar60._8_4_ = -(uint)(auVar52._8_4_ < auVar61._8_4_);
              auVar60._12_4_ = -(uint)(auVar52._12_4_ < auVar61._12_4_);
              auVar61 = ~auVar60 & auVar52 | auVar61 & auVar60;
              auVar45._0_4_ = -(uint)(auVar61._0_4_ < auVar35._0_4_);
              auVar45._4_4_ = -(uint)(auVar61._4_4_ < auVar35._4_4_);
              auVar45._8_4_ = -(uint)(auVar61._8_4_ < auVar35._8_4_);
              auVar45._12_4_ = -(uint)(auVar61._12_4_ < auVar35._12_4_);
              auVar46 = ~auVar45 & auVar61 | auVar35 & auVar45;
              auVar36._0_4_ = -(uint)(auVar58._0_4_ < auVar46._0_4_);
              auVar36._4_4_ = -(uint)(auVar58._4_4_ < auVar46._4_4_);
              auVar36._8_4_ = -(uint)(auVar58._8_4_ < auVar46._8_4_);
              auVar36._12_4_ = -(uint)(auVar58._12_4_ < auVar46._12_4_);
              auVar53._0_4_ = -(uint)(iVar41 == -1);
              auVar53._4_4_ = -(uint)(iVar42 == -1);
              auVar53._8_4_ = -(uint)(iVar43 == -1);
              auVar53._12_4_ = -(uint)(iVar44 == -1);
              auVar63._4_4_ = iStack_114;
              auVar63._0_4_ = local_118;
              auVar63._8_4_ = iStack_110;
              auVar63._12_4_ = iStack_10c;
              auVar47 = auVar63 & auVar53 | ~auVar53 & (~auVar36 & auVar58 | auVar46 & auVar36);
              iVar54 = auVar47._0_4_;
              iVar55 = auVar47._4_4_;
              iVar56 = auVar47._8_4_;
              iVar51 = auVar47._12_4_;
              if (3 < uVar19) {
                auVar37._0_4_ = -(uint)(iVar54 < auVar38._0_4_);
                auVar37._4_4_ = -(uint)(iVar55 < auVar38._4_4_);
                auVar37._8_4_ = -(uint)(iVar56 < auVar38._8_4_);
                auVar37._12_4_ = -(uint)(iVar51 < auVar38._12_4_);
                auVar38 = ~auVar37 & auVar38 | auVar47 & auVar37;
                auVar30._0_4_ = -(uint)(iVar54 < auVar24._0_4_);
                auVar30._4_4_ = -(uint)(iVar55 < auVar24._4_4_);
                auVar30._8_4_ = -(uint)(iVar56 < auVar24._8_4_);
                auVar30._12_4_ = -(uint)(iVar51 < auVar24._12_4_);
                auVar24 = auVar24 & auVar30 | ~auVar30 & auVar47;
              }
              piVar4 = ((ppVar10->field_4).rowcols)->score_row;
              if (uVar19 < uVar23) {
                *(int *)((long)piVar4 + uVar19 * 4 + local_f0) = iVar51;
              }
              if (uVar19 - 1 < uVar23 && (uVar16 | 1) < uVar22) {
                *(int *)((long)piVar4 + uVar19 * 4 + local_e8) = iVar56;
              }
              if (((uVar16 | 2) < uVar22) && ((long)(uVar19 - 2) < (long)uVar23 && 1 < uVar19)) {
                *(int *)((long)piVar4 + uVar19 * 4 + local_f8) = iVar55;
              }
              if (2 < uVar19 && uVar17 < uVar22) {
                *(int *)((long)piVar4 + uVar19 * 4 + local_e0) = iVar54;
              }
              auVar6._4_4_ = iVar14;
              auVar6._0_4_ = iVar14;
              auVar6._8_4_ = iVar14;
              auVar6._12_4_ = iVar14;
              auVar63 = ~auVar53 & auVar58 | auVar6 & auVar53;
              auVar46 = ~auVar53 & auVar61 | auVar6 & auVar53;
              ptr_00[uVar19] = iVar54;
              ptr_01[uVar19] = auVar63._0_4_;
              auVar39._0_4_ = -(uint)(iVar41 == iVar29);
              auVar39._4_4_ = -(uint)(iVar42 == iVar29);
              auVar39._8_4_ = -(uint)(iVar43 == iVar29);
              auVar39._12_4_ = -(uint)(iVar44 == iVar29);
              auVar26 = ~(auVar39 & auVar40) & auVar26 | auVar47 & auVar39 & auVar40;
              iVar41 = iVar41 + 1;
              iVar42 = iVar42 + 1;
              iVar43 = iVar43 + 1;
              iVar44 = iVar44 + 1;
              uVar19 = uVar19 + 1;
              iVar54 = iVar48;
              iVar55 = iVar49;
              iVar56 = iVar50;
              iVar57 = iVar2;
            } while (uVar12 != uVar19);
            uVar31 = uVar31 + 4;
            uVar32 = uVar32 + 4;
            uVar33 = uVar33 + 4;
            uVar34 = uVar34 + 4;
            local_118 = local_118 + gap * -4;
            iStack_114 = iStack_114 + gap * -4;
            iStack_110 = iStack_110 + gap * -4;
            iStack_10c = iStack_10c + gap * -4;
            local_e0 = local_e0 + lVar11;
            local_f0 = local_f0 + lVar11;
            local_e8 = local_e8 + lVar11;
            local_f8 = local_f8 + lVar11;
            uVar16 = uVar1;
          } while (uVar1 < uVar22);
        }
        iVar29 = 4;
        iVar13 = iVar14;
        do {
          if (iVar13 < auVar26._12_4_) {
            iVar13 = auVar26._12_4_;
          }
          lVar11 = auVar26._8_8_;
          uVar22 = auVar26._0_8_;
          auVar26._0_8_ = uVar22 << 0x20;
          auVar26._8_8_ = lVar11 << 0x20 | uVar22 >> 0x20;
          iVar29 = iVar29 + -1;
        } while (iVar29 != 0);
        auVar27._0_4_ = -(uint)(auVar38._0_4_ < iVar14);
        auVar27._4_4_ = -(uint)(auVar38._4_4_ < iVar14);
        auVar27._8_4_ = -(uint)(auVar38._8_4_ < iVar14);
        auVar27._12_4_ = -(uint)(auVar38._12_4_ < iVar14);
        auVar25._0_4_ = -(uint)(iVar7 < auVar24._0_4_);
        auVar25._4_4_ = -(uint)(iVar7 < auVar24._4_4_);
        auVar25._8_4_ = -(uint)(iVar7 < auVar24._8_4_);
        auVar25._12_4_ = -(uint)(iVar7 < auVar24._12_4_);
        iVar7 = movmskps(0,auVar25 | auVar27);
        if (iVar7 != 0) {
          *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
          local_d8 = 0;
          iVar13 = 0;
        }
        ppVar10->score = iVar13;
        ppVar10->end_query = (undefined4)local_d8;
        ppVar10->end_ref = local_d8._4_4_;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_130);
          return ppVar10;
        }
        return ppVar10;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMax = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32_rpl(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32_rpl(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32_rpl(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, F_pr[j], 3);
            vF = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32_rpl(vNWH, vE);
            vWH = _mm_max_epi32_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi32(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8_rpl(vMax, vWH, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm_extract_epi32_rpl(vMax, 3);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 4);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}